

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.h
# Opt level: O1

Counter * __thiscall
prometheus::Family<prometheus::Counter>::Add<>(Family<prometheus::Counter> *this,Labels *labels)

{
  Counter *pCVar1;
  __uniq_ptr_impl<prometheus::Counter,_std::default_delete<prometheus::Counter>_> local_20;
  
  detail::make_unique<prometheus::Counter>();
  pCVar1 = Add(this,labels,
               (unique_ptr<prometheus::Counter,_std::default_delete<prometheus::Counter>_> *)
               &local_20);
  if (local_20._M_t.
      super__Tuple_impl<0UL,_prometheus::Counter_*,_std::default_delete<prometheus::Counter>_>.
      super__Head_base<0UL,_prometheus::Counter_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_prometheus::Counter_*,_std::default_delete<prometheus::Counter>_>)0x0) {
    operator_delete((void *)local_20._M_t.
                            super__Tuple_impl<0UL,_prometheus::Counter_*,_std::default_delete<prometheus::Counter>_>
                            .super__Head_base<0UL,_prometheus::Counter_*,_false>._M_head_impl);
  }
  return pCVar1;
}

Assistant:

T& Add(const Labels& labels, Args&&... args) {
    return Add(labels, detail::make_unique<T>(args...));
  }